

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

bool __thiscall
dxil_spv::CFGStructurizer::query_reachability_through_back_edges
          (CFGStructurizer *this,CFGNode *from,CFGNode *to)

{
  bool bVar1;
  
  bVar1 = CFGNode::dominates(to,from);
  if ((bVar1) && (to = to->pred_back_edge, to == (CFGNode *)0x0)) {
    return false;
  }
  bVar1 = query_reachability(this,from,to);
  return bVar1;
}

Assistant:

bool CFGStructurizer::query_reachability_through_back_edges(const CFGNode &from, const CFGNode &to) const
{
	if (to.dominates(&from))
	{
		// If we're dominated by end node, only way we can reach is through a back edge.
		return to.pred_back_edge && query_reachability(from, *to.pred_back_edge);
	}
	else
		return query_reachability(from, to);
}